

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

void __thiscall clickhouse::Type::~Type(Type *this)

{
  _Base_ptr *pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *puVar2;
  ulong uVar3;
  EnumImpl *this_01;
  
  switch(this->code_) {
  case DateTime:
  case DateTime64:
    this_01 = (EnumImpl *)(this->field_1).date_time_;
    if (this_01 != (EnumImpl *)0x0) {
      puVar2 = *(undefined1 **)
                &(this_01->value_to_name)._M_t._M_impl.super__Rb_tree_header._M_header;
      pp_Var1 = &(this_01->value_to_name)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Base_ptr *)puVar2 != pp_Var1) {
        operator_delete(puVar2,(ulong)((long)&(*pp_Var1)->_M_color + 1));
      }
      uVar3 = 0x28;
LAB_00149190:
      operator_delete(this_01,uVar3);
      return;
    }
    break;
  case Array:
  case Nullable:
    this_01 = (EnumImpl *)(this->field_1).array_;
    if (this_01 != (EnumImpl *)0x0) {
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 &(this_01->value_to_name)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      uVar3 = 0x10;
      goto LAB_00149190;
    }
    break;
  case Tuple:
    this_01 = (EnumImpl *)(this->field_1).array_;
    if (this_01 != (EnumImpl *)0x0) {
      std::
      vector<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
      ::~vector((vector<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
                 *)this_01);
      uVar3 = 0x18;
      goto LAB_00149190;
    }
    break;
  case Enum8:
  case Enum16:
    this_01 = (this->field_1).enum_;
    if (this_01 != (EnumImpl *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
      ::~_Rb_tree(&(this_01->name_to_value)._M_t);
      std::
      _Rb_tree<short,_std::pair<const_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<short,_std::pair<const_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<short>,_std::allocator<std::pair<const_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this_01);
      uVar3 = 0x60;
      goto LAB_00149190;
    }
    break;
  case Decimal:
  case Decimal32:
  case Decimal64:
  case Decimal128:
    this_01 = (EnumImpl *)(this->field_1).array_;
    if (this_01 != (EnumImpl *)0x0) {
      uVar3 = 0x10;
      goto LAB_00149190;
    }
  }
  return;
}

Assistant:

Type::~Type() {
    if (code_ == Array) {
        delete array_;
    } else if (code_ == DateTime || code_ == DateTime64) {
        delete date_time_;
    } else if (code_ == Tuple) {
        delete tuple_;
    } else if (code_ == Nullable) {
        delete nullable_;
    } else if (code_ == Enum8 || code_ == Enum16) {
        delete enum_;
    } else if (code_== Decimal || code_== Decimal32 || code_ == Decimal64 || code_ == Decimal128) {
        delete decimal_;
    }
}